

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EqHelper.cpp
# Opt level: O0

bool Kernel::EqHelper::hasGreaterEqualitySide(Literal *eq,Ordering *ord,TermList *lhs,TermList *rhs)

{
  undefined1 uVar1;
  Result RVar2;
  Literal *in_RDI;
  Ordering *in_stack_fffffffffffffff8;
  
  RVar2 = Ordering::getEqualityArgumentOrder(in_stack_fffffffffffffff8,in_RDI);
  uVar1 = (*(code *)(&DAT_00ef4f08 + *(int *)(&DAT_00ef4f08 + (ulong)(RVar2 - GREATER) * 4)))();
  return (bool)uVar1;
}

Assistant:

bool EqHelper::hasGreaterEqualitySide(Literal* eq, const Ordering& ord, TermList& lhs, TermList& rhs)
{
  ASS(eq->isEquality());

  switch(ord.getEqualityArgumentOrder(eq)) {
    case Ordering::INCOMPARABLE:
      return false;
    case Ordering::GREATER:
      lhs = *eq->nthArgument(0);
      rhs = *eq->nthArgument(1);
      return true;
    case Ordering::LESS:
      lhs = *eq->nthArgument(1);
      rhs = *eq->nthArgument(0);
      return true;
    //there should be no equality literals of equal terms
    case Ordering::EQUAL:
      ASSERTION_VIOLATION;
  }
  ASSERTION_VIOLATION;
}